

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_show_select.cpp
# Opt level: O1

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::Transformer::TransformShowSelect(Transformer *this,PGVariableShowSelectStmt *stmt)

{
  int iVar1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var3;
  undefined8 uVar4;
  SelectNode *this_00;
  pointer pSVar5;
  tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_> this_01;
  ShowRef *this_02;
  pointer pSVar6;
  long in_RDX;
  templated_unique_single_t select_node;
  templated_unique_single_t show_ref;
  undefined1 local_60 [24];
  __buckets_ptr local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = (SelectNode *)operator_new(0xf0);
  SelectNode::SelectNode(this_00);
  local_60._8_8_ = this_00;
  pSVar5 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)(local_60 + 8));
  this_01.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       )operator_new(0x110);
  local_48 = (__buckets_ptr)0x0;
  local_40._M_local_buf[0] = '\0';
  local_60._16_8_ = &local_40;
  StarExpression::StarExpression
            ((StarExpression *)
             this_01.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,
             (string *)(local_60 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._16_8_ != &local_40) {
    operator_delete((void *)local_60._16_8_);
  }
  local_60._0_8_ =
       this_01.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar5->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)local_60);
  if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
      local_60._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_60._0_8_ + 8))();
  }
  this_02 = (ShowRef *)operator_new(0x98);
  ShowRef::ShowRef(this_02);
  iVar1 = *(int *)(in_RDX + 0x18);
  local_60._16_8_ = this_02;
  pSVar6 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                     ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                      (local_60 + 0x10));
  pSVar6->show_type = iVar1 == 0;
  TransformSelectNode((Transformer *)local_60,(PGNode *)stmt,SUB81(*(undefined8 *)(in_RDX + 8),0));
  pSVar6 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                     ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                      (local_60 + 0x10));
  uVar4 = local_60._0_8_;
  local_60._0_8_ =
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)0x0;
  _Var2._M_head_impl =
       (pSVar6->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pSVar6->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)uVar4;
  if (_Var2._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
  }
  if ((ParsedExpression *)local_60._0_8_ != (ParsedExpression *)0x0) {
    (*((BaseExpression *)local_60._0_8_)->_vptr_BaseExpression[1])();
  }
  uVar4 = local_60._16_8_;
  local_60._16_8_ = (long *)0x0;
  pSVar5 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)(local_60 + 8));
  _Var3._M_head_impl =
       (pSVar5->from_table).
       super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pSVar5->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar4;
  if (_Var3._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_TableRef + 8))();
  }
  uVar4 = local_60._8_8_;
  local_60._8_8_ = (ParserOptions *)0x0;
  (this->parent).ptr = (Transformer *)uVar4;
  if ((long *)local_60._16_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_60._16_8_ + 8))();
  }
  if ((ParserOptions *)local_60._8_8_ != (ParserOptions *)0x0) {
    (**(code **)(*(long *)local_60._8_8_ + 8))();
  }
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> Transformer::TransformShowSelect(duckdb_libpgquery::PGVariableShowSelectStmt &stmt) {
	// we capture the select statement of SHOW
	auto select_node = make_uniq<SelectNode>();
	select_node->select_list.push_back(make_uniq<StarExpression>());

	auto show_ref = make_uniq<ShowRef>();
	show_ref->show_type = stmt.is_summary ? ShowType::SUMMARY : ShowType::DESCRIBE;
	show_ref->query = TransformSelectNode(*stmt.stmt);
	select_node->from_table = std::move(show_ref);
	return std::move(select_node);
}